

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O2

bool __thiscall
AddressMap<HeapProfileTable::AllocValue>::FindAndRemove
          (AddressMap<HeapProfileTable::AllocValue> *this,Key key,AllocValue *removed_value)

{
  Entry *pEVar1;
  uintptr_t uVar2;
  Entry *e;
  Cluster *pCVar3;
  Entry *pEVar4;
  bool bVar5;
  
  bVar5 = false;
  pCVar3 = FindCluster(this,(Number)key,false);
  if (pCVar3 != (Cluster *)0x0) {
    pEVar1 = (Entry *)((long)pCVar3->blocks + (ulong)((uint)((ulong)key >> 4) & 0xfff8));
    do {
      pEVar4 = pEVar1;
      pEVar1 = pEVar4->next;
      if (pEVar1 == (Entry *)0x0) {
        return false;
      }
    } while (pEVar1->key != key);
    uVar2 = (pEVar1->value).bucket_rep;
    removed_value->bytes = (pEVar1->value).bytes;
    removed_value->bucket_rep = uVar2;
    pEVar4->next = pEVar1->next;
    pEVar1->next = this->free_;
    this->free_ = pEVar1;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool AddressMap<Value>::FindAndRemove(Key key, Value* removed_value) {
  const Number num = reinterpret_cast<Number>(key);
  Cluster* const c = FindCluster(num, false/*do not create*/);
  if (c != nullptr) {
    for (Entry** p = &c->blocks[BlockID(num)]; *p != nullptr; p = &(*p)->next) {
      Entry* e = *p;
      if (e->key == key) {
        *removed_value = e->value;
        *p = e->next;         // Remove e from linked-list
        e->next = free_;      // Add e to free-list
        free_ = e;
        return true;
      }
    }
  }
  return false;
}